

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O0

DdManager *
Aig_ManComputeGlobalBdds(Aig_Man_t *p,int nBddSizeMax,int fDropInternal,int fReorder,int fVerbose)

{
  uint numVars;
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  DdNode *pDVar4;
  int local_50;
  int local_4c;
  int Counter;
  int i;
  DdNode *bFunc;
  DdManager *dd;
  Aig_Obj_t *pObj;
  ProgressBar *pProgress;
  int fVerbose_local;
  int fReorder_local;
  int fDropInternal_local;
  int nBddSizeMax_local;
  Aig_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  pProgress._0_4_ = fVerbose;
  pProgress._4_4_ = fReorder;
  fVerbose_local = fDropInternal;
  fReorder_local = nBddSizeMax;
  _fDropInternal_local = p;
  numVars = Aig_ManCiNum(p);
  bFunc = &Cudd_Init(numVars,0,0x100,0x40000,0)->sentinel;
  if (pProgress._4_4_ != 0) {
    Cudd_AutodynEnable((DdManager *)bFunc,CUDD_REORDER_SYMM_SIFT);
  }
  Aig_ManCleanData(_fDropInternal_local);
  pAVar3 = Aig_ManConst1(_fDropInternal_local);
  Aig_ObjSetGlobalBdd(pAVar3,*(DdNode **)(bFunc + 1));
  Cudd_Ref(*(DdNode **)(bFunc + 1));
  for (local_4c = 0; iVar2 = local_4c, iVar1 = Vec_PtrSize(_fDropInternal_local->vCis),
      iVar2 < iVar1; local_4c = local_4c + 1) {
    dd = (DdManager *)Vec_PtrEntry(_fDropInternal_local->vCis,local_4c);
    Aig_ObjSetGlobalBdd((Aig_Obj_t *)dd,
                        *(DdNode **)(&(bFunc[8].type.kids.E)->index + (long)local_4c * 2));
    Cudd_Ref(*(DdNode **)(&(bFunc[8].type.kids.E)->index + (long)local_4c * 2));
  }
  local_50 = 0;
  local_4c = 0;
  while( true ) {
    iVar2 = local_4c;
    iVar1 = Vec_PtrSize(_fDropInternal_local->vCos);
    if (iVar1 <= iVar2) {
      Aig_ManResetRefs(_fDropInternal_local);
      if (pProgress._4_4_ != 0) {
        Cudd_ReduceHeap((DdManager *)bFunc,CUDD_REORDER_SYMM_SIFT,1);
        Cudd_AutodynDisable((DdManager *)bFunc);
      }
      return (DdManager *)bFunc;
    }
    dd = (DdManager *)Vec_PtrEntry(_fDropInternal_local->vCos,local_4c);
    pDVar4 = bFunc;
    pAVar3 = Aig_ObjFanin0((Aig_Obj_t *)dd);
    pDVar4 = Bbr_NodeGlobalBdds_rec
                       ((DdManager *)pDVar4,pAVar3,fReorder_local,fVerbose_local,(ProgressBar *)pObj
                        ,&local_50,(int)pProgress);
    _Counter = pDVar4;
    if (pDVar4 == (DdNode *)0x0) break;
    iVar2 = Aig_ObjFaninC0((Aig_Obj_t *)dd);
    _Counter = (DdNode *)((ulong)pDVar4 ^ (long)iVar2);
    Cudd_Ref(_Counter);
    Aig_ObjSetGlobalBdd((Aig_Obj_t *)dd,_Counter);
    local_4c = local_4c + 1;
  }
  if ((int)pProgress != 0) {
    printf("Constructing global BDDs is aborted.\n");
  }
  Aig_ManFreeGlobalBdds(_fDropInternal_local,(DdManager *)bFunc);
  Cudd_Quit((DdManager *)bFunc);
  Aig_ManResetRefs(_fDropInternal_local);
  return (DdManager *)0x0;
}

Assistant:

DdManager * Aig_ManComputeGlobalBdds( Aig_Man_t * p, int nBddSizeMax, int fDropInternal, int fReorder, int fVerbose )
{
    ProgressBar * pProgress = NULL;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bFunc;
    int i, Counter;
    // start the manager
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // set reordering
    if ( fReorder )
        Cudd_AutodynEnable( dd, CUDD_REORDER_SYMM_SIFT );
    // prepare to construct global BDDs
    Aig_ManCleanData( p );
    // assign the constant node BDD
    Aig_ObjSetGlobalBdd( Aig_ManConst1(p), dd->one );   Cudd_Ref( dd->one );
    // set the elementary variables
    Aig_ManForEachCi( p, pObj, i )
    {
        Aig_ObjSetGlobalBdd( pObj, dd->vars[i] );  Cudd_Ref( dd->vars[i] );
    }

    // collect the global functions of the COs
    Counter = 0;
    // construct the BDDs
//    pProgress = Extra_ProgressBarStart( stdout, Aig_ManNodeNum(p) );
    Aig_ManForEachCo( p, pObj, i )
    {
        bFunc = Bbr_NodeGlobalBdds_rec( dd, Aig_ObjFanin0(pObj), nBddSizeMax, fDropInternal, pProgress, &Counter, fVerbose );
        if ( bFunc == NULL )
        {
            if ( fVerbose )
            printf( "Constructing global BDDs is aborted.\n" );
            Aig_ManFreeGlobalBdds( p, dd );
            Cudd_Quit( dd ); 
            // reset references
            Aig_ManResetRefs( p );
            return NULL;
        }
        bFunc = Cudd_NotCond( bFunc, Aig_ObjFaninC0(pObj) );  Cudd_Ref( bFunc ); 
        Aig_ObjSetGlobalBdd( pObj, bFunc );
    }
//    Extra_ProgressBarStop( pProgress );
    // reset references
    Aig_ManResetRefs( p );
    // reorder one more time
    if ( fReorder )
    {
        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 1 );
        Cudd_AutodynDisable( dd );
    }
//    Cudd_PrintInfo( dd, stdout );
    return dd;
}